

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall
StatisticsWriter::writeMatrix<double>
          (StatisticsWriter *this,ostream *stream,MultivariateTracker *tracker,string *title,
          offset_in_MultivariateTracker_to_subr matrix)

{
  iterator __n;
  bool bVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  long lVar4;
  size_type __n_00;
  reference pvVar5;
  reference plVar6;
  size_type *psVar7;
  ostream *poVar8;
  size_type __n_01;
  long *plVar9;
  long in_R9;
  double dVar10;
  code *local_2e0;
  code *local_210;
  string local_1c8;
  int local_1a4;
  size_type local_1a0;
  long j_1;
  long i_3;
  string local_188 [8];
  string indent;
  size_type local_140;
  long i_2;
  allocator<char> local_129;
  string local_128 [8];
  string footer;
  string local_100 [8];
  string header;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_d8;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_d0;
  iterator it;
  long totalWidth;
  long j;
  long i_1;
  size_type local_90;
  long i;
  allocator<long> local_71;
  value_type_conflict2 local_70;
  undefined1 local_68 [8];
  vector<long,_std::allocator<long>_> width;
  int numDim;
  offset_in_MultivariateTracker_to_subr matrix_local;
  string *title_local;
  MultivariateTracker *tracker_local;
  ostream *stream_local;
  StatisticsWriter *this_local;
  
  lVar4 = MultivariateTracker::getDimension(tracker);
  width.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = (int)lVar4;
  __n_00 = (size_type)
           width.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_;
  local_70 = 0;
  std::allocator<long>::allocator(&local_71);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_68,__n_00,&local_70,&local_71);
  std::allocator<long>::~allocator(&local_71);
  for (local_90 = 0;
      (long)local_90 <
      (long)width.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_; local_90 = local_90 + 1) {
    MultivariateTracker::getName_abi_cxx11_((string *)&i_1,tracker,local_90);
    pvVar5 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_68,local_90);
    StringParser::updateWidthString((string *)&i_1,pvVar5);
    std::__cxx11::string::~string((string *)&i_1);
  }
  for (j = 0; j < width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_; j = j + 1) {
    for (totalWidth = 0;
        totalWidth <
        width.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_; totalWidth = totalWidth + 1) {
      plVar9 = (long *)((long)&(tracker->_covariance).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + in_R9);
      local_210 = (code *)matrix;
      if ((matrix & 1) != 0) {
        local_210 = *(code **)(*plVar9 + (matrix - 1));
      }
      dVar10 = (double)(*local_210)(plVar9,j,totalWidth);
      pvVar5 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)local_68,totalWidth);
      StringParser::updateWidthNumber<double>(dVar10,pvVar5);
    }
  }
  it._M_current = (long *)0x0;
  local_d0._M_current =
       (long *)std::vector<long,_std::allocator<long>_>::begin
                         ((vector<long,_std::allocator<long>_> *)local_68);
  while( true ) {
    local_d8._M_current =
         (long *)std::vector<long,_std::allocator<long>_>::end
                           ((vector<long,_std::allocator<long>_> *)local_68);
    bVar1 = __gnu_cxx::operator!=(&local_d0,&local_d8);
    if (!bVar1) break;
    plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&local_d0);
    *plVar6 = *plVar6 + 3;
    plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&local_d0);
    it._M_current = *plVar6 + it._M_current;
    __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
              (&local_d0);
  }
  header.field_2._8_8_ = 0x14;
  psVar7 = (size_type *)std::max<long>((long *)&it,(long *)(header.field_2._M_local_buf + 8));
  plVar9 = (long *)*psVar7;
  it._M_current = plVar9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,(size_type)plVar9,'=',(allocator<char> *)(footer.field_2._M_local_buf + 0xf))
  ;
  std::allocator<char>::~allocator((allocator<char> *)(footer.field_2._M_local_buf + 0xf));
  __n = it;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_128,(size_type)__n._M_current,'-',&local_129);
  std::allocator<char>::~allocator(&local_129);
  poVar8 = std::operator<<((ostream *)stream,(string *)this);
  poVar8 = std::operator<<(poVar8,local_100);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)stream,(string *)this);
  _Var2 = std::setfill<char>(' ');
  poVar8 = std::operator<<(poVar8,_Var2._M_c);
  _Var3 = std::setw((int)((ulong)((long)it._M_current - ((long)it._M_current >> 0x3f)) >> 1));
  poVar8 = std::operator<<(poVar8,_Var3);
  poVar8 = std::operator<<(poVar8,(string *)title);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)stream,(string *)this);
  poVar8 = std::operator<<(poVar8,local_100);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)stream,(string *)this);
  if (width.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ == 0) {
    poVar8 = std::operator<<((ostream *)stream,"No Data");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  else {
    for (local_140 = 0;
        (long)local_140 <
        (long)width.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_; local_140 = local_140 + 1) {
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)stream,std::right);
      pvVar5 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)local_68,local_140);
      _Var3 = std::setw((int)*pvVar5);
      poVar8 = std::operator<<(poVar8,_Var3);
      MultivariateTracker::getName_abi_cxx11_
                ((string *)((long)&indent.field_2 + 8),tracker,local_140);
      std::operator<<(poVar8,(string *)(indent.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(indent.field_2._M_local_buf + 8));
    }
    std::ostream::operator<<((ostream *)stream,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<((ostream *)stream,(string *)this);
    poVar8 = std::operator<<(poVar8,local_128);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    __n_01 = std::__cxx11::string::size((string *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_188,__n_01,' ',(allocator<char> *)((long)&i_3 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_3 + 7));
    for (j_1 = 0; j_1 < width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_; j_1 = j_1 + 1) {
      std::operator<<((ostream *)stream,local_188);
      for (local_1a0 = 0;
          (long)local_1a0 <
          (long)width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_; local_1a0 = local_1a0 + 1) {
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)stream,std::right);
        pvVar5 = std::vector<long,_std::allocator<long>_>::operator[]
                           ((vector<long,_std::allocator<long>_> *)local_68,local_1a0);
        local_1a4 = (int)std::setw((int)*pvVar5);
        poVar8 = std::operator<<(poVar8,(_Setw)local_1a4);
        plVar9 = (long *)((long)&(tracker->_covariance).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start + in_R9);
        local_2e0 = (code *)matrix;
        if ((matrix & 1) != 0) {
          local_2e0 = *(code **)(*plVar9 + (matrix - 1));
        }
        dVar10 = (double)(*local_2e0)(plVar9,j_1,local_1a0);
        StringParser::parseNumber<double>(&local_1c8,dVar10,false);
        std::operator<<(poVar8,(string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
      }
      std::ostream::operator<<((ostream *)stream,std::endl<char,std::char_traits<char>>);
    }
    std::ostream::operator<<((ostream *)stream,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_188);
  }
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_100);
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_68)
  ;
  return;
}

Assistant:

void
    writeMatrix(std::ostream & stream,
                MultivariateTracker & tracker,
                std::string const & title,
                T (MultivariateTracker::*matrix)(long const i, long const j) const)
    {

        int numDim = tracker.getDimension();

        // Compute column widths
        std::vector<long> width(numDim,0);
        for (long i = 0; i < numDim; i++)
        {
            StringParser::updateWidthString(tracker.getName(i), width[i]);
        }
        for (long i = 0; i < numDim; i++)
        {
            for (long j = 0; j < numDim; j++)
            {
                StringParser::updateWidthNumber<T>((tracker.*matrix)(i,j), width[j]);
            }
        }

        long totalWidth = 0;
        for (std::vector<long>::iterator it = width.begin(); it != width.end(); ++it)
        {
            (*it) += 3;
            totalWidth += *it;
        }
        totalWidth = std::max<long>(totalWidth, 20);

        // Print data headers
        std::string header(totalWidth,'='); 
        std::string footer(totalWidth,'-'); 
        stream << this->_comment << header << std::endl;
        stream << this->_comment << std::setfill (' ') << std::setw (totalWidth/2) << title << std::endl;
        stream << this->_comment << header << std::endl;
        stream << this->_comment;
        if (numDim == 0)
        {
            stream << "No Data" << std::endl;
            return;
        }
        for (long i = 0; i < numDim; i++)
        {
            stream << std::right << std::setw(width[i]) << tracker.getName(i);
        }
        stream << std::endl;
        stream << this->_comment << footer << std::endl;

        // Print data
        std::string indent(this->_comment.size(),' '); 
        for (long i = 0; i < numDim; i++)
        {
            stream << indent;
            for (long j = 0; j < numDim; j++)
            {
                stream << std::right << std::setw(width[j]) << StringParser::parseNumber<T>((tracker.*matrix)(i,j));
            }
            stream << std::endl;
        }
        stream << std::endl;
    
        return;
        
    }